

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O2

aom_codec_err_t ctrl_get_new_frame_image(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  aom_image_t *img;
  int iVar2;
  aom_codec_err_t aVar3;
  undefined8 *puVar4;
  void *user_priv;
  YV12_BUFFER_CONFIG new_frame;
  
  uVar1 = args->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    puVar4 = (undefined8 *)((ulong)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    puVar4 = (undefined8 *)args->overflow_arg_area;
    args->overflow_arg_area = puVar4 + 1;
  }
  img = (aom_image_t *)*puVar4;
  if (img == (aom_image_t *)0x0) {
    aVar3 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    iVar2 = av1_get_last_show_frame(ctx->ppi->cpi,&new_frame);
    if (iVar2 == 0) {
      yuvconfig2image(img,&new_frame,user_priv);
      aVar3 = AOM_CODEC_OK;
    }
    else {
      aVar3 = AOM_CODEC_ERROR;
    }
  }
  return aVar3;
}

Assistant:

static aom_codec_err_t ctrl_get_new_frame_image(aom_codec_alg_priv_t *ctx,
                                                va_list args) {
  aom_image_t *const new_img = va_arg(args, aom_image_t *);

  if (new_img != NULL) {
    YV12_BUFFER_CONFIG new_frame;

    if (av1_get_last_show_frame(ctx->ppi->cpi, &new_frame) == 0) {
      yuvconfig2image(new_img, &new_frame, NULL);
      return AOM_CODEC_OK;
    } else {
      return AOM_CODEC_ERROR;
    }
  } else {
    return AOM_CODEC_INVALID_PARAM;
  }
}